

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

void toml::detail::
     throw_key_not_found_error<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,key *ky)

{
  out_of_range *poVar1;
  char (*in_R8) [35];
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  source_location loc;
  allocator_type local_151;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  string local_138;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  source_location local_70;
  
  source_location::source_location
            (&local_70,
             (v->region_info_).
             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((local_70.line_num_ == 1) && (local_70.region_size_ == 0)) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[35]>
              (&local_138,(toml *)"key \"",(char (*) [6])ky,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" not found in the top-level table",in_R8);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[25],_true>(&local_e0,&local_70,(char (*) [25])"the parsed file is empty");
    __l._M_len = 1;
    __l._M_array = &local_e0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_150,__l,&local_151);
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_118,&local_138,&local_150,&local_f8,false);
    std::out_of_range::out_of_range(poVar1,(string *)&local_118);
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
  if ((local_70.line_num_ == 1) && (local_70.region_size_ == 1)) {
    concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[35]>
              (&local_138,(toml *)"key \"",(char (*) [6])ky,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" not found in the top-level table",in_R8);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[32],_true>
              (&local_e0,&local_70,(char (*) [32])"the top-level table starts here");
    __l_00._M_len = 1;
    __l_00._M_array = &local_e0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_150,__l_00,&local_151);
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_118,&local_138,&local_150,&local_f8,false);
    std::out_of_range::out_of_range(poVar1,(string *)&local_118);
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  concat_to_string<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[12]>
            (&local_138,(toml *)"key \"",(char (*) [6])ky,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\" not found",
             (char (*) [12])in_R8);
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>(&local_e0,&local_70,(char (*) [14])"in this table");
  __l_01._M_len = 1;
  __l_01._M_array = &local_e0;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_150,__l_01,&local_151);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_underline(&local_118,&local_138,&local_150,&local_f8,false);
  std::out_of_range::out_of_range(poVar1,(string *)&local_118);
  __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

[[noreturn]] void
throw_key_not_found_error(const Value& v, const key& ky)
{
    // The top-level table has its region at the first character of the file.
    // That means that, in the case when a key is not found in the top-level
    // table, the error message points to the first character. If the file has
    // its first table at the first line, the error message would be like this.
    // ```console
    // [error] key "a" not found
    //  --> example.toml
    //    |
    //  1 | [table]
    //    | ^------ in this table
    // ```
    // It actually points to the top-level table at the first character,
    // not `[table]`. But it is too confusing. To avoid the confusion, the error
    // message should explicitly say "key not found in the top-level table",
    // or "the parsed file is empty" if there is no content at all (0 bytes in file).
    const auto loc = v.location();
    if(loc.line() == 1 && loc.region() == 0)
    {
        // First line with a zero-length region means "empty file".
        // The region will be generated at `parse_toml_file` function
        // if the file contains no bytes.
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found in the top-level table"), {
                {loc, "the parsed file is empty"}
            }));
    }
    else if(loc.line() == 1 && loc.region() == 1)
    {
        // Here it assumes that top-level table starts at the first character.
        // The region corresponds to the top-level table will be generated at
        // `parse_toml_file` function.
        //     It also assumes that the top-level table size is just one and
        // the line number is `1`. It is always satisfied. And those conditions
        // are satisfied only if the table is the top-level table.
        //
        // 1. one-character dot-key at the first line
        // ```toml
        // a.b = "c"
        // ```
        // toml11 counts whole key as the table key. Here, `a.b` is the region
        // of the table "a". It could be counter intuitive, but it works.
        // The size of the region is 3, not 1. The above example is the shortest
        // dot-key example. The size cannot be 1.
        //
        // 2. one-character inline-table at the first line
        // ```toml
        // a = {b = "c"}
        // ```
        // toml11 considers the inline table body as the table region. Here,
        // `{b = "c"}` is the region of the table "a". The size of the region
        // is 9, not 1. The shotest inline table still has two characters, `{`
        // and `}`. The size cannot be 1.
        //
        // 3. one-character table declaration at the first line
        // ```toml
        // [a]
        // ```
        // toml11 considers the whole table key as the table region. Here,
        // `[a]` is the table region. The size is 3, not 1.
        //
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found in the top-level table"), {
                {loc, "the top-level table starts here"}
            }));
    }
    else
    {
        // normal table.
        throw std::out_of_range(format_underline(concat_to_string(
            "key \"", ky, "\" not found"), { {loc, "in this table"} }));
    }
}